

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString __thiscall SimpleString::printable(SimpleString *this)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  size_t extraout_RDX;
  long lVar4;
  size_t extraout_RDX_00;
  long lVar5;
  char cVar6;
  SimpleString *in_RSI;
  size_t n;
  long lVar7;
  long lVar8;
  SimpleString SVar9;
  SimpleString hexEscapeCode;
  SimpleString local_40;
  
  this->buffer_ = (char *)0x0;
  this->bufferSize_ = 0;
  copyBufferToNewInternalBuffer(this,"");
  sVar3 = getPrintableSize(in_RSI);
  setInternalBufferToNewBuffer(this,sVar3 + 1);
  lVar7 = -1;
  do {
    lVar8 = lVar7 + 1;
    lVar7 = lVar7 + 1;
  } while (in_RSI->buffer_[lVar8] != '\0');
  pcVar1 = this->buffer_;
  sVar3 = extraout_RDX;
  if (lVar7 == 0) {
    lVar8 = 0;
  }
  else {
    lVar5 = 0;
    lVar8 = 0;
    do {
      cVar6 = in_RSI->buffer_[lVar5];
      if ((byte)(cVar6 - 7U) < 7) {
        if (pcVar1 != (char *)0x0) {
          pcVar2 = printable::shortEscapeCodes[(byte)(cVar6 - 7U)];
          cVar6 = *pcVar2;
          pcVar1[lVar8] = cVar6;
          if (cVar6 != '\0') {
            pcVar1[lVar8 + 1] = pcVar2[1];
          }
        }
        lVar8 = lVar8 + 2;
      }
      else if ((byte)(cVar6 + 0x81U) < 0xa1) {
        StringFromFormat((char *)&local_40,"\\x%02X ",(ulong)(uint)(int)cVar6);
        if (pcVar1 != (char *)0x0) {
          cVar6 = *local_40.buffer_;
          pcVar1[lVar8] = cVar6;
          lVar4 = 1;
          do {
            if (cVar6 == '\0') break;
            cVar6 = local_40.buffer_[lVar4];
            pcVar1[lVar4 + lVar8] = cVar6;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
        }
        deallocateInternalBuffer(&local_40);
        lVar8 = lVar8 + 4;
        sVar3 = extraout_RDX_00;
      }
      else {
        pcVar1[lVar8] = cVar6;
        lVar8 = lVar8 + 1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar7 != lVar5);
  }
  pcVar1[lVar8] = '\0';
  SVar9.bufferSize_ = sVar3;
  SVar9.buffer_ = (char *)this;
  return SVar9;
}

Assistant:

SimpleString SimpleString::printable() const
{
    static const char* shortEscapeCodes[] =
    {
        "\\a",
        "\\b",
        "\\t",
        "\\n",
        "\\v",
        "\\f",
        "\\r"
    };

    SimpleString result;
    result.setInternalBufferToNewBuffer(getPrintableSize() + 1);

    size_t str_size = size();
    size_t j = 0;
    for (size_t i = 0; i < str_size; i++)
    {
        char c = buffer_[i];
        if (isControlWithShortEscapeSequence(c))
        {
            StrNCpy(&result.buffer_[j], shortEscapeCodes[(unsigned char)(c - '\a')], 2);
            j += 2;
        }
        else if (isControl(c))
        {
            SimpleString hexEscapeCode = StringFromFormat("\\x%02X ", c);
            StrNCpy(&result.buffer_[j], hexEscapeCode.asCharString(), 4);
            j += 4;
        }
        else
        {
            result.buffer_[j] = c;
            j++;
        }
    }
    result.buffer_[j] = 0;

    return result;
}